

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O3

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_-1,_false>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_-1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>_>,_Eigen::internal::sub_assign_op<double,_double>,_0>,_4,_0>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>_>,_Eigen::internal::sub_assign_op<double,_double>,_0>
           *kernel)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  DstXprType *pDVar5;
  PointerType pdVar6;
  long lVar7;
  DstEvaluatorType *pDVar8;
  SrcEvaluatorType *pSVar9;
  PointerType pdVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  char *__function;
  Index row;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  Index row_1;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  Index row_2;
  
  pDVar5 = kernel->m_dstExpr;
  pdVar6 = (pDVar5->
           super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
           ).
           super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_0>
           .m_data;
  if (((ulong)pdVar6 & 7) == 0) {
    lVar7 = (pDVar5->
            super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
            ).
            super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
            .
            super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_1>
            .
            super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_0>
            .m_cols.m_value;
    if (0 < lVar7) {
      uVar11 = (pDVar5->
               super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
               ).
               super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_0>
               .m_rows.m_value;
      uVar18 = (ulong)((uint)((ulong)pdVar6 >> 3) & 1);
      if ((long)uVar11 <= (long)uVar18) {
        uVar18 = uVar11;
      }
      lVar15 = 0;
      lVar16 = 0;
      do {
        if (0 < (long)uVar18) {
          pSVar9 = kernel->m_src;
          if ((pSVar9->
              super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              ).m_lhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.m_rows
              < 1) goto LAB_0013bf2a;
          if ((pSVar9->
              super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              ).m_rhs.
              super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value <= lVar16) goto LAB_0013bf13;
          pdVar10 = (kernel->m_dst->
                    super_block_evaluator<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
                    ).
                    super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_3,_3>_>
                    .m_data;
          pdVar10[lVar16 * 3] =
               pdVar10[lVar16 * 3] -
               (pSVar9->
               super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
               ).m_lhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0] *
               (pSVar9->
               super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
               ).m_rhs.
               super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_data[lVar16];
        }
        uVar21 = uVar11 - uVar18 & 0xfffffffffffffffe;
        lVar17 = uVar21 + uVar18;
        uVar20 = uVar18;
        if (0 < (long)uVar21) {
          do {
            pdVar10 = (kernel->m_dst->
                      super_block_evaluator<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
                      ).
                      super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_3,_3>_>
                      .m_data;
            pdVar1 = (kernel->m_src->
                     super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                     ).m_lhsImpl.
                     super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>_>
                     .m_d.data + uVar20;
            dVar12 = pdVar1[1];
            dVar4 = (kernel->m_src->
                    super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                    ).m_rhsImpl.
                    super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<double,_1,__1,_1,_1,_3>_>
                    .m_data[lVar16];
            pdVar2 = (double *)((long)pdVar10 + uVar20 * 8 + lVar15);
            dVar13 = pdVar2[1];
            pdVar3 = (double *)((long)pdVar10 + uVar20 * 8 + lVar15);
            *pdVar3 = *pdVar2 - dVar4 * *pdVar1;
            pdVar3[1] = dVar13 - dVar4 * dVar12;
            uVar20 = uVar20 + 2;
          } while ((long)uVar20 < lVar17);
        }
        if (lVar17 < (long)uVar11) {
          pSVar9 = kernel->m_src;
          lVar19 = (pSVar9->
                   super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                   ).m_lhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                   m_rows;
          pdVar10 = (kernel->m_dst->
                    super_block_evaluator<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
                    ).
                    super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_3,_3>_>
                    .m_data;
          lVar14 = lVar17;
          do {
            if ((lVar17 < 0) || (lVar19 <= lVar14)) goto LAB_0013bf2a;
            if ((pSVar9->
                super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                ).m_rhs.
                super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_cols.m_value <= lVar16) goto LAB_0013bf13;
            *(double *)((long)pdVar10 + lVar14 * 8 + lVar15) =
                 *(double *)((long)pdVar10 + lVar14 * 8 + lVar15) -
                 (pSVar9->
                 super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                 ).m_lhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[lVar14] *
                 (pSVar9->
                 super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                 ).m_rhs.
                 super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data[lVar16];
            lVar14 = lVar14 + 1;
          } while (lVar14 < (long)uVar11);
        }
        uVar18 = (uVar18 + 1) - ((uVar18 - ((long)(uVar18 + 1) >> 0x3f)) + 1 & 0xfffffffffffffffe);
        if ((long)uVar11 < (long)uVar18) {
          uVar18 = uVar11;
        }
        lVar16 = lVar16 + 1;
        lVar15 = lVar15 + 0x18;
      } while (lVar16 != lVar7);
    }
  }
  else {
    lVar7 = (pDVar5->
            super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
            ).
            super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
            .
            super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_1>
            .
            super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_0>
            .m_cols.m_value;
    if (0 < lVar7) {
      lVar15 = (pDVar5->
               super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
               ).
               super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_0>
               .m_rows.m_value;
      pDVar8 = kernel->m_dst;
      pSVar9 = kernel->m_src;
      lVar16 = 0;
      lVar17 = 0;
      do {
        if (0 < lVar15) {
          lVar19 = (pSVar9->
                   super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                   ).m_lhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                   m_rows;
          if (lVar19 < 1) {
            lVar19 = 0;
          }
          pdVar10 = (pDVar8->
                    super_block_evaluator<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false,_true>
                    ).
                    super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,__1,__1,_false>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_3,_3>_>
                    .m_data;
          lVar14 = 0;
          do {
            if (lVar19 == lVar14) goto LAB_0013bf2a;
            if ((pSVar9->
                super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                ).m_rhs.
                super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_cols.m_value <= lVar17) goto LAB_0013bf13;
            *(double *)((long)pdVar10 + lVar14 * 8 + lVar16) =
                 *(double *)((long)pdVar10 + lVar14 * 8 + lVar16) -
                 (pSVar9->
                 super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                 ).m_lhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[lVar14] *
                 (pSVar9->
                 super_product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                 ).m_rhs.
                 super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data[lVar17];
            lVar14 = lVar14 + 1;
          } while (lVar15 != lVar14);
        }
        lVar17 = lVar17 + 1;
        lVar16 = lVar16 + 0x18;
      } while (lVar17 != lVar7);
    }
  }
  return;
LAB_0013bf2a:
  __function = 
  "Eigen::Block<const Eigen::Matrix<double, -1, 1, 0, 3, 1>, 1, 1>::Block(XprType &, Index) [XprType = const Eigen::Matrix<double, -1, 1, 0, 3, 1>, BlockRows = 1, BlockCols = 1, InnerPanel = false]"
  ;
  goto LAB_0013bf3f;
LAB_0013bf13:
  __function = 
  "Eigen::Block<const Eigen::Map<Eigen::Matrix<double, 1, -1, 1, 1, 3>>, 1, 1>::Block(XprType &, Index) [XprType = const Eigen::Map<Eigen::Matrix<double, 1, -1, 1, 1, 3>>, BlockRows = 1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_0013bf3f:
  __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Block.h"
                ,0x7a,__function);
}

Assistant:

EIGEN_DEVICE_FUNC const Scalar* dstDataPtr() const
  {
    return m_dstExpr.data();
  }